

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglRenderTests.cpp
# Opt level: O3

void __thiscall
deqp::egl::SingleThreadRenderCase::executeForContexts
          (SingleThreadRenderCase *this,EGLDisplay display,EGLSurface surface,Config *config,
          vector<std::pair<int,_void_*>,_std::allocator<std::pair<int,_void_*>_>_> *contexts)

{
  ostringstream *poVar1;
  TextureFormat log;
  pointer ppVar2;
  long *plVar3;
  bool bVar4;
  bool bVar5;
  EGLint EVar6;
  EGLint height;
  EGLint depthBits;
  EGLint stencilBits;
  EGLint EVar7;
  deUint32 dVar8;
  int iVar9;
  Library *egl;
  ulong uVar10;
  pointer pDVar11;
  Program *pPVar12;
  long *plVar13;
  int *piVar14;
  uint uVar15;
  allocator_type *__a;
  Vec4 *color;
  iterator drawOp;
  pointer pSVar16;
  uint uVar17;
  undefined *__n;
  bool bVar18;
  _Vector_base<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp,_std::allocator<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp>_>
  *this_00;
  size_t __n_00;
  long lVar19;
  float depth;
  PixelFormat PVar20;
  vector<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp,_std::allocator<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp>_>
  drawOps;
  Surface refFrame;
  vector<de::SharedPtr<deqp::egl::(anonymous_namespace)::Program>,_std::allocator<de::SharedPtr<deqp::egl::(anonymous_namespace)::Program>_>_>
  programs;
  Surface frame;
  PixelFormat pixelFmt;
  Random rnd;
  vector<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp,_std::allocator<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp>_>
  local_248;
  Surface local_230;
  ulong local_218;
  pointer local_210;
  vector<de::SharedPtr<deqp::egl::(anonymous_namespace)::Program>,_std::allocator<de::SharedPtr<deqp::egl::(anonymous_namespace)::Program>_>_>
  local_208;
  TextureFormat local_1f0;
  Surface local_1e8;
  PixelFormat local_1d0;
  deRandom local_1c0;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  
  egl = EglTestContext::getLibrary
                  ((this->super_MultiContextRenderCase).super_RenderCase.super_SimpleConfigCase.
                   super_TestCase.m_eglTestCtx);
  EVar6 = eglu::querySurfaceInt(egl,display,surface,0x3057);
  height = eglu::querySurfaceInt(egl,display,surface,0x3056);
  uVar10 = (long)(contexts->
                 super__Vector_base<std::pair<int,_void_*>,_std::allocator<std::pair<int,_void_*>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish -
           (long)(contexts->
                 super__Vector_base<std::pair<int,_void_*>,_std::allocator<std::pair<int,_void_*>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
  PVar20 = anon_unknown_4::getPixelFormat(egl,display,config->config);
  local_1d0 = PVar20;
  depthBits = eglu::getConfigAttribInt(egl,display,config->config,0x3025);
  stencilBits = eglu::getConfigAttribInt(egl,display,config->config,0x3026);
  EVar7 = eglu::getConfigAttribInt(egl,display,config->config,0x3031);
  log = (TextureFormat)
        ((this->super_MultiContextRenderCase).super_RenderCase.super_SimpleConfigCase.super_TestCase
         .super_TestCase.super_TestNode.m_testCtx)->m_log;
  tcu::Surface::Surface(&local_230,EVar6,height);
  tcu::Surface::Surface(&local_1e8,EVar6,height);
  dVar8 = deStringHash((this->super_MultiContextRenderCase).super_RenderCase.super_SimpleConfigCase.
                       super_TestCase.super_TestCase.super_TestNode.m_name._M_dataplus._M_p);
  uVar15 = (uint)(uVar10 >> 4);
  uVar17 = ((uint)(uVar10 >> 0x14) & 0xffff ^ uVar15 ^ 0x3d) * 9;
  uVar17 = (uVar17 >> 4 ^ uVar17) * 0x27d4eb2d;
  deRandom_init(&local_1c0,uVar17 >> 0xf ^ dVar8 ^ uVar17);
  std::
  vector<de::SharedPtr<deqp::egl::(anonymous_namespace)::Program>,_std::allocator<de::SharedPtr<deqp::egl::(anonymous_namespace)::Program>_>_>
  ::vector(&local_208,
           (long)(contexts->
                 super__Vector_base<std::pair<int,_void_*>,_std::allocator<std::pair<int,_void_*>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish -
           (long)(contexts->
                 super__Vector_base<std::pair<int,_void_*>,_std::allocator<std::pair<int,_void_*>_>_>
                 )._M_impl.super__Vector_impl_data._M_start >> 4,__a);
  local_248.
  super__Vector_base<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp,_std::allocator<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_248.
  super__Vector_base<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp,_std::allocator<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_248.
  super__Vector_base<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp,_std::allocator<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  poVar1 = (ostringstream *)(local_1b0 + 8);
  local_1b0._0_8_ = log;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"EGL_RED_SIZE = ",0xf);
  std::ostream::operator<<(poVar1,PVar20.redBits);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_138);
  poVar1 = (ostringstream *)(local_1b0 + 8);
  local_1b0._0_8_ = log;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"EGL_GREEN_SIZE = ",0x11);
  std::ostream::operator<<(poVar1,PVar20.greenBits);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_138);
  poVar1 = (ostringstream *)(local_1b0 + 8);
  local_1b0._0_8_ = log;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"EGL_BLUE_SIZE = ",0x10);
  std::ostream::operator<<(poVar1,PVar20.blueBits);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_138);
  poVar1 = (ostringstream *)(local_1b0 + 8);
  local_1b0._0_8_ = log;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"EGL_ALPHA_SIZE = ",0x11);
  std::ostream::operator<<(poVar1,PVar20.alphaBits);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_138);
  poVar1 = (ostringstream *)(local_1b0 + 8);
  local_1b0._0_8_ = log;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"EGL_DEPTH_SIZE = ",0x11);
  std::ostream::operator<<(poVar1,depthBits);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_138);
  poVar1 = (ostringstream *)(local_1b0 + 8);
  local_1b0._0_8_ = log;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"EGL_STENCIL_SIZE = ",0x13);
  std::ostream::operator<<(poVar1,stencilBits);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_138);
  poVar1 = (ostringstream *)(local_1b0 + 8);
  local_1b0._0_8_ = log;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"EGL_SAMPLES = ",0xe);
  std::ostream::operator<<(poVar1,EVar7);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  __n = &std::__cxx11::ostringstream::VTT;
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_138);
  iVar9 = uVar15 * 4;
  if (iVar9 != 0) {
    if (iVar9 < 0) {
      std::__throw_length_error("vector::_M_default_append");
    }
    this_00 = (_Vector_base<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp,_std::allocator<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp>_>
               *)(long)iVar9;
    pDVar11 = std::
              _Vector_base<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp,_std::allocator<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp>_>
              ::_M_allocate(this_00,(size_t)__n);
    __n_00 = (long)this_00 * 0x48;
    memset(pDVar11,0,__n_00);
    local_248.
    super__Vector_base<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp,_std::allocator<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp>_>
    ._M_impl.super__Vector_impl_data._M_finish = pDVar11 + (long)this_00;
    local_248.
    super__Vector_base<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp,_std::allocator<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp>_>
    ._M_impl.super__Vector_impl_data._M_start = pDVar11;
    local_248.
    super__Vector_base<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp,_std::allocator<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_248.
         super__Vector_base<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp,_std::allocator<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    do {
      anon_unknown_4::randomizeDrawOp((Random *)&local_1c0,pDVar11);
      pDVar11 = pDVar11 + 1;
      __n_00 = __n_00 - 0x48;
    } while (__n_00 != 0);
  }
  if (0 < (int)uVar15) {
    uVar10 = (ulong)(uVar15 & 0x7fffffff);
    lVar19 = 0;
    do {
      ppVar2 = (contexts->
               super__Vector_base<std::pair<int,_void_*>,_std::allocator<std::pair<int,_void_*>_>_>)
               ._M_impl.super__Vector_impl_data._M_start;
      EVar6 = *(EGLint *)((long)&ppVar2->first + lVar19);
      (*egl->_vptr_Library[0x27])
                (egl,display,surface,surface,*(undefined8 *)((long)&ppVar2->second + lVar19));
      dVar8 = (*egl->_vptr_Library[0x1f])();
      eglu::checkError(dVar8,"makeCurrent(display, surface, surface, context)",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRenderTests.cpp"
                       ,0x2e2);
      pPVar12 = anon_unknown_4::createProgram(&this->m_gl,EVar6);
      plVar13 = (long *)operator_new(0x20);
      pSVar16 = local_208.
                super__Vector_base<de::SharedPtr<deqp::egl::(anonymous_namespace)::Program>,_std::allocator<de::SharedPtr<deqp::egl::(anonymous_namespace)::Program>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      *(undefined4 *)(plVar13 + 1) = 0;
      *(undefined4 *)((long)plVar13 + 0xc) = 0;
      *plVar13 = (long)&PTR__SharedPtrState_02120650;
      plVar13[2] = (long)pPVar12;
      *(undefined4 *)(plVar13 + 1) = 1;
      *(undefined4 *)((long)plVar13 + 0xc) = 1;
      plVar3 = *(long **)((long)&(local_208.
                                  super__Vector_base<de::SharedPtr<deqp::egl::(anonymous_namespace)::Program>,_std::allocator<de::SharedPtr<deqp::egl::(anonymous_namespace)::Program>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->m_state + lVar19);
      if (plVar3 != plVar13) {
        if (plVar3 != (long *)0x0) {
          LOCK();
          plVar3 = plVar3 + 1;
          *(int *)plVar3 = (int)*plVar3 + -1;
          UNLOCK();
          if ((int)*plVar3 == 0) {
            *(undefined8 *)
             ((long)&(local_208.
                      super__Vector_base<de::SharedPtr<deqp::egl::(anonymous_namespace)::Program>,_std::allocator<de::SharedPtr<deqp::egl::(anonymous_namespace)::Program>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->m_ptr + lVar19) = 0;
            (**(code **)(**(long **)((long)&(local_208.
                                             super__Vector_base<de::SharedPtr<deqp::egl::(anonymous_namespace)::Program>,_std::allocator<de::SharedPtr<deqp::egl::(anonymous_namespace)::Program>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start)->m_state +
                                    lVar19) + 0x10))();
          }
          LOCK();
          piVar14 = (int *)(*(long *)((long)&pSVar16->m_state + lVar19) + 0xc);
          *piVar14 = *piVar14 + -1;
          UNLOCK();
          if (*piVar14 == 0) {
            plVar3 = *(long **)((long)&pSVar16->m_state + lVar19);
            if (plVar3 != (long *)0x0) {
              (**(code **)(*plVar3 + 8))();
            }
            *(undefined8 *)((long)&pSVar16->m_state + lVar19) = 0;
          }
        }
        *(Program **)((long)&pSVar16->m_ptr + lVar19) = pPVar12;
        *(long **)((long)&pSVar16->m_state + lVar19) = plVar13;
        LOCK();
        *(int *)(plVar13 + 1) = (int)plVar13[1] + 1;
        UNLOCK();
        LOCK();
        piVar14 = (int *)(*(long *)((long)&pSVar16->m_state + lVar19) + 0xc);
        *piVar14 = *piVar14 + 1;
        UNLOCK();
      }
      plVar3 = plVar13 + 1;
      LOCK();
      *(int *)plVar3 = (int)*plVar3 + -1;
      UNLOCK();
      if ((int)*plVar3 == 0) {
        (**(code **)(*plVar13 + 0x10))(plVar13);
      }
      piVar14 = (int *)((long)plVar13 + 0xc);
      LOCK();
      *piVar14 = *piVar14 + -1;
      UNLOCK();
      if (*piVar14 == 0) {
        (**(code **)(*plVar13 + 8))(plVar13);
      }
      (**(code **)(**(long **)((long)&(local_208.
                                       super__Vector_base<de::SharedPtr<deqp::egl::(anonymous_namespace)::Program>,_std::allocator<de::SharedPtr<deqp::egl::(anonymous_namespace)::Program>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->m_ptr + lVar19) +
                  0x10))();
      lVar19 = lVar19 + 0x10;
      uVar10 = uVar10 - 1;
    } while (uVar10 != 0);
  }
  ppVar2 = (contexts->
           super__Vector_base<std::pair<int,_void_*>,_std::allocator<std::pair<int,_void_*>_>_>).
           _M_impl.super__Vector_impl_data._M_start;
  EVar6 = ppVar2->first;
  (*egl->_vptr_Library[0x27])(egl,display,surface,surface,ppVar2->second);
  dVar8 = (*egl->_vptr_Library[0x1f])();
  iVar9 = 0x2ed;
  eglu::checkError(dVar8,"makeCurrent(display, surface, surface, context)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRenderTests.cpp"
                   ,0x2ed);
  anon_unknown_4::clear(&this->m_gl,EVar6,color,depth,iVar9);
  anon_unknown_4::finish((Functions *)(this->m_gl).finish,EVar6);
  pDVar11 = local_248.
            super__Vector_base<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp,_std::allocator<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_210 = local_208.
              super__Vector_base<de::SharedPtr<deqp::egl::(anonymous_namespace)::Program>,_std::allocator<de::SharedPtr<deqp::egl::(anonymous_namespace)::Program>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_218 = (ulong)(uVar15 & 0x7fffffff);
  iVar9 = 0;
  bVar5 = true;
  do {
    bVar4 = bVar5;
    if (0 < (int)uVar15) {
      uVar10 = 0;
      do {
        ppVar2 = (contexts->
                 super__Vector_base<std::pair<int,_void_*>,_std::allocator<std::pair<int,_void_*>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        EVar6 = ppVar2[uVar10].first;
        (*egl->_vptr_Library[0x27])(egl,display,surface,surface,ppVar2[uVar10].second);
        dVar8 = (*egl->_vptr_Library[0x1f])();
        eglu::checkError(dVar8,"makeCurrent(display, surface, surface, context)",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRenderTests.cpp"
                         ,0x2fb);
        pSVar16 = local_210 + uVar10;
        lVar19 = 0;
        bVar5 = true;
        do {
          bVar18 = bVar5;
          anon_unknown_4::draw
                    (&this->m_gl,EVar6,pSVar16->m_ptr,
                     pDVar11 + (int)((iVar9 * uVar15 + (int)uVar10) * 2) + lVar19);
          lVar19 = 1;
          bVar5 = false;
        } while (bVar18);
        anon_unknown_4::finish((Functions *)(this->m_gl).finish,EVar6);
        uVar10 = uVar10 + 1;
      } while (uVar10 != local_218);
    }
    iVar9 = 1;
    bVar5 = false;
  } while (bVar4);
  ppVar2 = (contexts->
           super__Vector_base<std::pair<int,_void_*>,_std::allocator<std::pair<int,_void_*>_>_>).
           _M_impl.super__Vector_impl_data._M_start;
  EVar6 = ppVar2->first;
  (*egl->_vptr_Library[0x27])(egl,display,surface,surface,ppVar2->second);
  dVar8 = (*egl->_vptr_Library[0x1f])();
  eglu::checkError(dVar8,"makeCurrent(display, surface, surface, context)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRenderTests.cpp"
                   ,0x30c);
  anon_unknown_4::readPixels((Functions *)(this->m_gl).readPixels,EVar6,&local_1e8);
  (*egl->_vptr_Library[0x27])(egl,display,0,0,0);
  dVar8 = (*egl->_vptr_Library[0x1f])();
  eglu::checkError(dVar8,"makeCurrent(display, EGL_NO_SURFACE, EGL_NO_SURFACE, EGL_NO_CONTEXT)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRenderTests.cpp"
                   ,0x311);
  local_1f0.order = RGBA;
  local_1f0.type = UNORM_INT8;
  if ((void *)local_230.m_pixels.m_cap != (void *)0x0) {
    local_230.m_pixels.m_cap = (size_t)local_230.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)local_1b0,&local_1f0,local_230.m_width,local_230.m_height,1,
             (void *)local_230.m_pixels.m_cap);
  anon_unknown_4::renderReference
            ((PixelBufferAccess *)local_1b0,&local_248,&local_1d0,depthBits,stencilBits,
             (int)local_230.m_pixels.m_cap);
  bVar5 = tcu::fuzzyCompare((TestLog *)log,"ComparisonResult","Image comparison result",&local_230,
                            &local_1e8,0.02,COMPARE_LOG_RESULT);
  if (!bVar5) {
    tcu::TestContext::setTestResult
              ((this->super_MultiContextRenderCase).super_RenderCase.super_SimpleConfigCase.
               super_TestCase.super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "Image comparison failed");
  }
  std::
  vector<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp,_std::allocator<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp>_>
  ::~vector(&local_248);
  std::
  vector<de::SharedPtr<deqp::egl::(anonymous_namespace)::Program>,_std::allocator<de::SharedPtr<deqp::egl::(anonymous_namespace)::Program>_>_>
  ::~vector(&local_208);
  tcu::Surface::~Surface(&local_1e8);
  tcu::Surface::~Surface(&local_230);
  return;
}

Assistant:

void SingleThreadRenderCase::executeForContexts (EGLDisplay display, EGLSurface surface, const Config& config, const std::vector<std::pair<EGLint, EGLContext> >& contexts)
{
	const Library&			egl			= m_eglTestCtx.getLibrary();
	const int				width		= eglu::querySurfaceInt(egl, display, surface, EGL_WIDTH);
	const int				height		= eglu::querySurfaceInt(egl, display, surface, EGL_HEIGHT);
	const int				numContexts	= (int)contexts.size();
	const int				drawsPerCtx	= 2;
	const int				numIters	= 2;
	const float				threshold	= 0.02f;

	const tcu::PixelFormat	pixelFmt	= getPixelFormat(egl, display, config.config);
	const int				depthBits	= eglu::getConfigAttribInt(egl, display, config.config, EGL_DEPTH_SIZE);
	const int				stencilBits	= eglu::getConfigAttribInt(egl, display, config.config, EGL_STENCIL_SIZE);
	const int				numSamples	= eglu::getConfigAttribInt(egl, display, config.config, EGL_SAMPLES);

	TestLog&				log			= m_testCtx.getLog();

	tcu::Surface			refFrame	(width, height);
	tcu::Surface			frame		(width, height);

	de::Random				rnd			(deStringHash(getName()) ^ deInt32Hash(numContexts));
	vector<ProgramSp>		programs	(contexts.size());
	vector<DrawPrimitiveOp>	drawOps;

	// Log basic information about config.
	log << TestLog::Message << "EGL_RED_SIZE = "		<< pixelFmt.redBits << TestLog::EndMessage;
	log << TestLog::Message << "EGL_GREEN_SIZE = "		<< pixelFmt.greenBits << TestLog::EndMessage;
	log << TestLog::Message << "EGL_BLUE_SIZE = "		<< pixelFmt.blueBits << TestLog::EndMessage;
	log << TestLog::Message << "EGL_ALPHA_SIZE = "		<< pixelFmt.alphaBits << TestLog::EndMessage;
	log << TestLog::Message << "EGL_DEPTH_SIZE = "		<< depthBits << TestLog::EndMessage;
	log << TestLog::Message << "EGL_STENCIL_SIZE = "	<< stencilBits << TestLog::EndMessage;
	log << TestLog::Message << "EGL_SAMPLES = "			<< numSamples << TestLog::EndMessage;

	// Generate draw ops.
	drawOps.resize(numContexts*drawsPerCtx*numIters);
	for (vector<DrawPrimitiveOp>::iterator drawOp = drawOps.begin(); drawOp != drawOps.end(); ++drawOp)
		randomizeDrawOp(rnd, *drawOp);

	// Create and setup programs per context
	for (int ctxNdx = 0; ctxNdx < numContexts; ctxNdx++)
	{
		EGLint		api			= contexts[ctxNdx].first;
		EGLContext	context		= contexts[ctxNdx].second;

		EGLU_CHECK_CALL(egl, makeCurrent(display, surface, surface, context));

		programs[ctxNdx] = ProgramSp(createProgram(m_gl, api));
		programs[ctxNdx]->setup();
	}

	// Clear to black using first context.
	{
		EGLint		api			= contexts[0].first;
		EGLContext	context		= contexts[0].second;

		EGLU_CHECK_CALL(egl, makeCurrent(display, surface, surface, context));

		clear(m_gl, api, CLEAR_COLOR, CLEAR_DEPTH, CLEAR_STENCIL);
		finish(m_gl, api);
	}

	// Render.
	for (int iterNdx = 0; iterNdx < numIters; iterNdx++)
	{
		for (int ctxNdx = 0; ctxNdx < numContexts; ctxNdx++)
		{
			EGLint		api			= contexts[ctxNdx].first;
			EGLContext	context		= contexts[ctxNdx].second;

			EGLU_CHECK_CALL(egl, makeCurrent(display, surface, surface, context));

			for (int drawNdx = 0; drawNdx < drawsPerCtx; drawNdx++)
			{
				const DrawPrimitiveOp& drawOp = drawOps[iterNdx*numContexts*drawsPerCtx + ctxNdx*drawsPerCtx + drawNdx];
				draw(m_gl, api, *programs[ctxNdx], drawOp);
			}

			finish(m_gl, api);
		}
	}

	// Read pixels using first context. \todo [pyry] Randomize?
	{
		EGLint		api		= contexts[0].first;
		EGLContext	context	= contexts[0].second;

		EGLU_CHECK_CALL(egl, makeCurrent(display, surface, surface, context));

		readPixels(m_gl, api, frame);
	}

	EGLU_CHECK_CALL(egl, makeCurrent(display, EGL_NO_SURFACE, EGL_NO_SURFACE, EGL_NO_CONTEXT));

	// Render reference.
	// \note Reference image is always generated using single-sampling.
	renderReference(refFrame.getAccess(), drawOps, pixelFmt, depthBits, stencilBits, 1);

	// Compare images
	{
		bool imagesOk = tcu::fuzzyCompare(log, "ComparisonResult", "Image comparison result", refFrame, frame, threshold, tcu::COMPARE_LOG_RESULT);

		if (!imagesOk)
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image comparison failed");
	}
}